

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

void Mpm_ObjRecycleCuts(Mpm_Man_t *p,Mig_Obj_t *pObj)

{
  bool bVar1;
  Mpm_Cut_t *pMVar2;
  int local_28;
  int local_24;
  int hNext;
  int hCut;
  Mpm_Cut_t *pCut;
  Mig_Obj_t *pObj_local;
  Mpm_Man_t *p_local;
  
  local_24 = Mpm_ObjCutList(p,pObj);
  while( true ) {
    bVar1 = false;
    if (local_24 != 0) {
      pMVar2 = Mpm_CutFetch(p,local_24);
      bVar1 = false;
      if (pMVar2 != (Mpm_Cut_t *)0x0) {
        local_28 = pMVar2->hNext;
        bVar1 = true;
      }
    }
    if (!bVar1) break;
    Mmr_StepRecycle(p->pManCuts,local_24);
    local_24 = local_28;
  }
  Mpm_ObjSetCutList(p,pObj,0);
  return;
}

Assistant:

static inline void Mpm_ObjRecycleCuts( Mpm_Man_t * p, Mig_Obj_t * pObj )
{
    Mpm_Cut_t * pCut;
    int hCut, hNext;
    Mpm_ObjForEachCutSafe( p, pObj, hCut, pCut, hNext )
        Mmr_StepRecycle( p->pManCuts, hCut );
    Mpm_ObjSetCutList( p, pObj, 0 );
}